

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

size_t prt_tmd(wchar_t row,wchar_t col)

{
  timed_grade *ptVar1;
  size_t sVar2;
  char *str;
  timed_grade **pptVar3;
  undefined8 extraout_RDX;
  size_t sVar4;
  long lVar5;
  
  sVar4 = 0;
  for (lVar5 = 0; lVar5 != 0x35; lVar5 = lVar5 + 1) {
    if (player->timed[lVar5] != 0) {
      pptVar3 = &timed_effects[lVar5].grade;
      do {
        ptVar1 = *pptVar3;
        pptVar3 = &ptVar1->next;
      } while (ptVar1->max < (int)player->timed[lVar5]);
      if (ptVar1->name != (char *)0x0) {
        c_put_str(ptVar1->color,ptVar1->name,row,(int)sVar4 + col);
        sVar2 = strlen(ptVar1->name);
        sVar4 = sVar4 + sVar2 + 1;
        if (lVar5 == 10) {
          str = format("%d %%",(ulong)(uint)(int)(player->timed[10] / 100),
                       CONCAT62((int6)((ulong)extraout_RDX >> 0x10),player->timed[10] % 100));
          c_put_str(ptVar1->color,str,row,(int)sVar4 + col);
          sVar2 = strlen(str);
          sVar4 = sVar4 + sVar2 + 1;
        }
      }
    }
  }
  return sVar4;
}

Assistant:

static size_t prt_tmd(int row, int col)
{
	size_t i, len = 0;

	for (i = 0; i < TMD_MAX; i++) {
		if (player->timed[i]) {
			struct timed_grade *grade = timed_effects[i].grade;
			while (player->timed[i] > grade->max) {
				grade = grade->next;
			}
			if (!grade->name) continue;
			c_put_str(grade->color, grade->name, row, col + len);
			len += strlen(grade->name) + 1;

			/* Food meter */
			if (i == TMD_FOOD) {
				char *meter = format("%d %%", player->timed[i] / 100);
				c_put_str(grade->color, meter, row, col + len);
				len += strlen(meter) + 1;
			}
		}
	}

	return len;
}